

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t art_frozen_view(char *buf,size_t maxbytes,art_t *art)

{
  ulong uVar1;
  undefined8 *in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  size_t size;
  art_typecode_t t;
  char *before_align;
  char *initial_buf;
  art_t *in_stack_ffffffffffffffc0;
  byte local_31;
  ulong local_18;
  ulong local_10;
  size_t local_8;
  
  if ((in_RDI == (undefined8 *)0x0) || (in_RDX == (undefined8 *)0x0)) {
    local_8 = 0;
  }
  else {
    art_init_cleared(in_stack_ffffffffffffffc0);
    if (in_RSI < 8) {
      local_8 = 0;
    }
    else {
      *in_RDX = *in_RDI;
      if (in_RSI - 8 < 0x30) {
        local_8 = 0;
      }
      else {
        memcpy(in_RDX + 1,in_RDI + 1,0x30);
        memcpy(in_RDX + 7,in_RDI + 1,0x30);
        local_10 = (long)in_RDI + 0x3fU & 0xfffffffffffffff8;
        if (in_RSI - 0x38 < local_10 - (long)(in_RDI + 7)) {
          local_8 = 0;
        }
        else {
          local_18 = (in_RSI - 0x38) - (local_10 - (long)(in_RDI + 7));
          for (local_31 = 1; local_31 < 6; local_31 = local_31 + 1) {
            if (in_RDX[(ulong)local_31 + 7] != 0) {
              uVar1 = in_RDX[(ulong)local_31 + 7] * ART_NODE_SIZES[local_31];
              if (local_18 < uVar1) {
                return 0;
              }
              in_RDX[(ulong)local_31 + 0xd] = local_10;
              local_10 = uVar1 + local_10;
              local_18 = local_18 - uVar1;
            }
          }
          local_8 = local_10 - (long)in_RDI;
        }
      }
    }
  }
  return local_8;
}

Assistant:

size_t art_frozen_view(const char *buf, size_t maxbytes, art_t *art) {
    if (buf == NULL || art == NULL) {
        return 0;
    }
    const char *initial_buf = buf;
    art_init_cleared(art);

    if (maxbytes < sizeof(art->root)) {
        return 0;
    }
    memcpy(&art->root, buf, sizeof(art->root));
    buf += sizeof(art->root);
    maxbytes -= sizeof(art->root);

    if (maxbytes < sizeof(art->capacities)) {
        return 0;
    }
    _Static_assert(sizeof(art->first_free) == sizeof(art->capacities),
                   "first_free is read from capacities");
    memcpy(art->first_free, buf, sizeof(art->capacities));
    memcpy(art->capacities, buf, sizeof(art->capacities));
    buf += sizeof(art->capacities);
    maxbytes -= sizeof(art->capacities);

    // Alignment for leaves. The rest of the nodes are aligned the same way.
    const char *before_align = buf;
    buf = CROARING_ART_ALIGN_BUF(buf, alignof(art_leaf_t));
    if (maxbytes < (size_t)(buf - before_align)) {
        return 0;
    }
    maxbytes -= buf - before_align;

    for (art_typecode_t t = CROARING_ART_MIN_TYPE; t <= CROARING_ART_MAX_TYPE;
         ++t) {
        if (art->capacities[t] > 0) {
            size_t size = art->capacities[t] * ART_NODE_SIZES[t];
            if (maxbytes < size) {
                return 0;
            }
            art->nodes[t] = (char *)buf;
            buf += size;
            maxbytes -= size;
        }
    }
    return buf - initial_buf;
}